

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_function *tfunction)

{
  uint uVar1;
  t_struct *tstruct;
  t_type *ptVar2;
  string *psVar3;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_60 [8];
  string returntype;
  string arguments;
  t_function *tfunction_local;
  t_dart_generator *this_local;
  string *result;
  
  tstruct = t_function::get_arglist(tfunction);
  argument_list_abi_cxx11_((string *)((long)&returntype.field_2 + 8),this,tstruct);
  std::__cxx11::string::string((string *)local_60);
  ptVar2 = t_function::get_returntype(tfunction);
  uVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[4])();
  if ((uVar1 & 1) == 0) {
    ptVar2 = t_function::get_returntype(tfunction);
    type_name_abi_cxx11_(&local_d0,this,ptVar2);
    std::operator+(&local_b0,"Future<",&local_d0);
    std::operator+(&local_90,&local_b0,">");
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    std::__cxx11::string::operator=((string *)local_60,"Future");
  }
  local_d1 = 0;
  std::operator+(&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60," ");
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  std::__cxx11::string::string((string *)&local_198,(string *)psVar3);
  get_member_name(&local_178,this,&local_198);
  std::operator+(&local_138,&local_158,&local_178);
  std::operator+(&local_118,&local_138,"(");
  std::operator+(&local_f8,&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&returntype.field_2 + 8));
  std::operator+(__return_storage_ptr__,&local_f8,")");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_158);
  local_d1 = 1;
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(returntype.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::function_signature(t_function* tfunction) {
  std::string arguments = argument_list(tfunction->get_arglist());

  std::string returntype;
  if (tfunction->get_returntype()->is_void()) {
    returntype = "Future";
  } else {
    returntype = "Future<" + type_name(tfunction->get_returntype()) + ">";
  }

  std::string result = returntype + " " + get_member_name(tfunction->get_name()) +
                       "(" + arguments + ")";
  return result;
}